

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_gen_key(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uint nbits,int exponent)

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  mbedtls_mpi *X_02;
  mbedtls_mpi *X_03;
  int iVar1;
  size_t sVar2;
  mbedtls_mpi P1;
  mbedtls_mpi G;
  mbedtls_mpi H;
  mbedtls_mpi Q1;
  
  iVar1 = -0x4080;
  if (((((nbits & 1) == 0) && (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) &&
      (0x7f < nbits)) && (2 < exponent)) {
    mbedtls_mpi_init(&P1);
    mbedtls_mpi_init(&Q1);
    mbedtls_mpi_init(&H);
    mbedtls_mpi_init(&G);
    X = &ctx->E;
    iVar1 = mbedtls_mpi_lset(X,(ulong)(uint)exponent);
    if (iVar1 == 0) {
      X_00 = &ctx->P;
      X_01 = &ctx->Q;
      X_02 = &ctx->N;
      do {
        iVar1 = mbedtls_mpi_gen_prime(X_00,(ulong)(nbits >> 1),0,f_rng,p_rng);
        if ((iVar1 != 0) ||
           (iVar1 = mbedtls_mpi_gen_prime(X_01,(ulong)(nbits >> 1),0,f_rng,p_rng), iVar1 != 0))
        goto LAB_0010d8e3;
        iVar1 = mbedtls_mpi_cmp_mpi(X_00,X_01);
        if (iVar1 != 0) {
          iVar1 = mbedtls_mpi_mul_mpi(X_02,X_00,X_01);
          if (iVar1 != 0) goto LAB_0010d8e3;
          sVar2 = mbedtls_mpi_bitlen(X_02);
          if (sVar2 == nbits) {
            iVar1 = mbedtls_mpi_cmp_mpi(X_00,X_01);
            if (iVar1 < 0) {
              mbedtls_mpi_swap(X_00,X_01);
            }
            iVar1 = mbedtls_mpi_sub_int(&P1,X_00,1);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_sub_int(&Q1,X_01,1), iVar1 != 0))
            goto LAB_0010d8e3;
            iVar1 = mbedtls_mpi_mul_mpi(&H,&P1,&Q1);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_gcd(&G,X,&H), iVar1 != 0)) goto LAB_0010d8e3;
          }
        }
        iVar1 = mbedtls_mpi_cmp_int(&G,1);
      } while (iVar1 != 0);
      X_03 = &ctx->D;
      iVar1 = mbedtls_mpi_inv_mod(X_03,X,&H);
      if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_mod_mpi(&ctx->DP,X_03,&P1), iVar1 == 0)) &&
          (iVar1 = mbedtls_mpi_mod_mpi(&ctx->DQ,X_03,&Q1), iVar1 == 0)) &&
         (iVar1 = mbedtls_mpi_inv_mod(&ctx->QP,X_01,X_00), iVar1 == 0)) {
        sVar2 = mbedtls_mpi_bitlen(X_02);
        ctx->len = sVar2 + 7 >> 3;
        iVar1 = 0;
      }
    }
LAB_0010d8e3:
    mbedtls_mpi_free(&P1);
    mbedtls_mpi_free(&Q1);
    mbedtls_mpi_free(&H);
    mbedtls_mpi_free(&G);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      mbedtls_rsa_free(ctx);
      iVar1 = iVar1 + -0x4180;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_gen_key( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 unsigned int nbits, int exponent )
{
    int ret;
    mbedtls_mpi P1, Q1, H, G;

    if( f_rng == NULL || nbits < 128 || exponent < 3 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( nbits % 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_mpi_init( &P1 ); mbedtls_mpi_init( &Q1 );
    mbedtls_mpi_init( &H ); mbedtls_mpi_init( &G );

    /*
     * find primes P and Q with Q < P so that:
     * GCD( E, (P-1)*(Q-1) ) == 1
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &ctx->E, exponent ) );

    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->P, nbits >> 1, 0,
                                f_rng, p_rng ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->Q, nbits >> 1, 0,
                                f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &ctx->P, &ctx->Q ) == 0 )
            continue;

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->N, &ctx->P, &ctx->Q ) );
        if( mbedtls_mpi_bitlen( &ctx->N ) != nbits )
            continue;

        if( mbedtls_mpi_cmp_mpi( &ctx->P, &ctx->Q ) < 0 )
                                mbedtls_mpi_swap( &ctx->P, &ctx->Q );

        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P1, &ctx->P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q1, &ctx->Q, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P1, &Q1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->E, &H  ) );
    }
    while( mbedtls_mpi_cmp_int( &G, 1 ) != 0 );

    /*
     * D  = E^-1 mod ((P-1)*(Q-1))
     * DP = D mod (P - 1)
     * DQ = D mod (Q - 1)
     * QP = Q^-1 mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->D , &ctx->E, &H  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->DP, &ctx->D, &P1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->DQ, &ctx->D, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->QP, &ctx->Q, &ctx->P ) );

    ctx->len = ( mbedtls_mpi_bitlen( &ctx->N ) + 7 ) >> 3;

cleanup:

    mbedtls_mpi_free( &P1 ); mbedtls_mpi_free( &Q1 ); mbedtls_mpi_free( &H ); mbedtls_mpi_free( &G );

    if( ret != 0 )
    {
        mbedtls_rsa_free( ctx );
        return( MBEDTLS_ERR_RSA_KEY_GEN_FAILED + ret );
    }

    return( 0 );
}